

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O0

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::prune_to_min_complement
          (tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this,float *m)

{
  const_iterator __first;
  const_iterator __first_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference this_00;
  float *in_RSI;
  const_iterator in_RDI;
  float fVar6;
  iterator pos;
  uint row;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff38;
  reference in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff68;
  float fVar8;
  uint local_14;
  
  fVar8 = *in_RSI;
  fVar6 = tools::min_value<float>();
  if (fVar6 * 4.0 < fVar8) {
    local_14 = 0;
    while( true ) {
      sVar2 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)in_RDI._M_current);
      uVar7 = false;
      if (local_14 < sVar2) {
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               *)in_RDI._M_current,(ulong)local_14);
        sVar2 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
        uVar7 = sVar2 != 0;
      }
      if ((bool)uVar7 == false) break;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)in_RDI._M_current,(ulong)local_14);
      iVar4 = std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff38);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)in_RDI._M_current,(ulong)local_14);
      iVar5 = std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff38);
      std::
      lower_bound<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,float,boost::math::quadrature::detail::tanh_sinh_detail<float,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>::prune_to_min_complement(float_const&)::_lambda(float_const&,float_const&)_1_>
                (iVar4._M_current,iVar5._M_current,in_RSI);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)in_RDI._M_current,(ulong)local_14);
      std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                         in_stack_ffffffffffffff40,
                         (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                         in_stack_ffffffffffffff38);
      if (bVar1) {
        in_stack_ffffffffffffff40 =
             std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)in_RDI._M_current,(ulong)local_14);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff40,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff38);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)in_RDI._M_current,(ulong)local_14);
        std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff38);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff40,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff38);
        __first._M_current._4_4_ = fVar8;
        __first._M_current._0_4_ = in_stack_ffffffffffffff68;
        std::vector<float,_std::allocator<float>_>::erase
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT17(uVar7,in_stack_ffffffffffffff58),__first,in_RDI);
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               *)((long)in_RDI._M_current + 0x18),(ulong)local_14);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)((long)in_RDI._M_current + 0x18),(ulong)local_14);
        std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff38);
        this_00 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)in_RDI._M_current,(ulong)local_14);
        std::vector<float,_std::allocator<float>_>::size(this_00);
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)pvVar3,
                  (difference_type)in_stack_ffffffffffffff40);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff40,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff38);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      *)((long)in_RDI._M_current + 0x18),(ulong)local_14);
        std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff38);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff40,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_ffffffffffffff38);
        __first_00._M_current._4_4_ = fVar8;
        __first_00._M_current._0_4_ = in_stack_ffffffffffffff68;
        std::vector<float,_std::allocator<float>_>::erase
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT17(uVar7,in_stack_ffffffffffffff58),__first_00,in_RDI);
      }
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void tanh_sinh_detail<Real, Policy>::prune_to_min_complement(const Real& m)
{
   //
   // If our tables were constructed from pre-computed data, then they will have more values stored than we can ever use,
   // and although the table size at this stage won't be too large, if we calculate down to m_max_levels then they will
   // grow by a huge amount - doubling in size at each step - so lets prune them down, removing values which will never
   // be used:
   //
   if (m > tools::min_value<Real>() * 4)
   {
      for (unsigned row = 0; (row < m_abscissas.size()) && m_abscissas[row].size(); ++row)
      {
         typename std::vector<Real>::iterator pos = std::lower_bound(m_abscissas[row].begin(), m_abscissas[row].end(), m, [](const Real& a, const Real& b) { using std::fabs; return fabs(a) > fabs(b); });
         if (pos != m_abscissas[row].end())
         {
            m_abscissas[row].erase(pos, m_abscissas[row].end());
            m_weights[row].erase(m_weights[row].begin() + m_abscissas[row].size(), m_weights[row].end());
         }
      }
   }
}